

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,Options *options,GeneratorContext *generator_context
          ,string *error)

{
  bool bVar1;
  Syntax SVar2;
  string *__lhs;
  string *error_local;
  GeneratorContext *generator_context_local;
  Options *options_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  if ((options->is_descriptor & 1U) != 0) {
    __lhs = FileDescriptor::name_abi_cxx11_(file);
    bVar1 = std::operator!=(__lhs,&kDescriptorFile_abi_cxx11_);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)error,
                 "Can only generate PHP code for google/protobuf/descriptor.proto.\n");
      return false;
    }
  }
  if (((options->is_descriptor & 1U) == 0) &&
     (SVar2 = FileDescriptor::syntax(file), SVar2 != SYNTAX_PROTO3)) {
    std::__cxx11::string::operator=
              ((string *)error,
               "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
              );
    this_local._7_1_ = false;
  }
  else {
    anon_unknown_2::GenerateFile(file,options,generator_context);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const Options& options,
                         GeneratorContext* generator_context,
                         std::string* error) const {
  if (options.is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!options.is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, options, generator_context);

  return true;
}